

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psubw_mips(uint64_t fs,uint64_t ft)

{
  return CONCAT44((int)(fs >> 0x20) - (int)(ft >> 0x20),(int)fs - (int)ft);
}

Assistant:

uint64_t helper_psubw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] -= vt.uw[i];
    }
    return vs.d;
}